

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error handleUnknownEncoding(XML_Parser parser,XML_Char *encodingName)

{
  XML_UnknownEncodingHandler p_Var1;
  _func_void_ptr_size_t *p_Var2;
  int iVar3;
  void *pvVar4;
  ENCODING *pEVar5;
  long lVar6;
  XML_Error XVar7;
  code *pcVar8;
  XML_Encoding local_430;
  
  p_Var1 = parser->m_unknownEncodingHandler;
  XVar7 = XML_ERROR_UNKNOWN_ENCODING;
  if (p_Var1 != (XML_UnknownEncodingHandler)0x0) {
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      local_430.map[lVar6] = -1;
    }
    local_430.data = (void *)0x0;
    local_430.convert = (_func_int_void_ptr_char_ptr *)0x0;
    local_430.release = (_func_void_void_ptr *)0x0;
    iVar3 = (*p_Var1)(parser->m_unknownEncodingHandlerData,encodingName,&local_430);
    if (iVar3 != 0) {
      p_Var2 = (parser->m_mem).malloc_fcn;
      iVar3 = coda_XmlSizeOfUnknownEncoding();
      pvVar4 = (*p_Var2)((long)iVar3);
      parser->m_unknownEncodingMem = pvVar4;
      if (pvVar4 == (void *)0x0) {
        XVar7 = XML_ERROR_NO_MEMORY;
      }
      else {
        if (parser->m_ns == '\0') {
          pcVar8 = coda_XmlInitUnknownEncoding;
        }
        else {
          pcVar8 = coda_XmlInitUnknownEncodingNS;
        }
        pEVar5 = (ENCODING *)(*pcVar8)(pvVar4,&local_430,local_430.convert,local_430.data);
        if (pEVar5 != (ENCODING *)0x0) {
          parser->m_unknownEncodingData = local_430.data;
          parser->m_unknownEncodingRelease = local_430.release;
          parser->m_encoding = pEVar5;
          return XML_ERROR_NONE;
        }
      }
    }
    if (local_430.release != (_func_void_void_ptr *)0x0) {
      (*local_430.release)(local_430.data);
    }
  }
  return XVar7;
}

Assistant:

static enum XML_Error
handleUnknownEncoding(XML_Parser parser, const XML_Char *encodingName) {
  if (parser->m_unknownEncodingHandler) {
    XML_Encoding info;
    int i;
    for (i = 0; i < 256; i++)
      info.map[i] = -1;
    info.convert = NULL;
    info.data = NULL;
    info.release = NULL;
    if (parser->m_unknownEncodingHandler(parser->m_unknownEncodingHandlerData,
                                         encodingName, &info)) {
      ENCODING *enc;
      parser->m_unknownEncodingMem = MALLOC(parser, XmlSizeOfUnknownEncoding());
      if (! parser->m_unknownEncodingMem) {
        if (info.release)
          info.release(info.data);
        return XML_ERROR_NO_MEMORY;
      }
      enc = (parser->m_ns ? XmlInitUnknownEncodingNS : XmlInitUnknownEncoding)(
          parser->m_unknownEncodingMem, info.map, info.convert, info.data);
      if (enc) {
        parser->m_unknownEncodingData = info.data;
        parser->m_unknownEncodingRelease = info.release;
        parser->m_encoding = enc;
        return XML_ERROR_NONE;
      }
    }
    if (info.release != NULL)
      info.release(info.data);
  }
  return XML_ERROR_UNKNOWN_ENCODING;
}